

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O0

void __thiscall Scope::AddNewSymbol(Scope *this,Symbol *sym)

{
  code *pcVar1;
  bool bVar2;
  CharacterBuffer<char16_t> *name;
  undefined4 *puVar3;
  Symbol *sym_local;
  Scope *this_local;
  
  if (this->scopeType == ScopeType_Global) {
    Symbol::SetIsGlobal(sym,true);
  }
  Symbol::SetScope(sym,this);
  name = Symbol::GetName(sym);
  bVar2 = HasSymbolName(this,name);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/Scope.h"
                       ,0x96,"(!HasSymbolName(this, sym->GetName()))",
                       "!HasSymbolName(this, sym->GetName())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Symbol::SetNext(sym,this->m_symList);
  this->m_symList = sym;
  this->m_count = this->m_count + 1;
  return;
}

Assistant:

void AddNewSymbol(Symbol *sym)
    {
        if (scopeType == ScopeType_Global)
        {
            sym->SetIsGlobal(true);
        }
        sym->SetScope(this);
        Assert(!HasSymbolName(this, sym->GetName()));
        sym->SetNext(m_symList);
        m_symList = sym;
        m_count++;
    }